

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

bool DerBase::DecodeSetOrSequenceOf<GeneralName>
               (DerType type,uchar *pIn,size_t cbIn,size_t *cbPrefix,size_t *cbSize,
               vector<GeneralName,_std::allocator<GeneralName>_> *out)

{
  bool bVar1;
  overflow_error *this;
  undefined1 local_98 [8];
  GeneralName t;
  size_t cbElement;
  size_t offset;
  vector<GeneralName,_std::allocator<GeneralName>_> *pvStack_38;
  bool isNull;
  vector<GeneralName,_std::allocator<GeneralName>_> *out_local;
  size_t *cbSize_local;
  size_t *cbPrefix_local;
  size_t cbIn_local;
  uchar *pIn_local;
  DerType type_local;
  
  offset._7_1_ = 0;
  pvStack_38 = out;
  out_local = (vector<GeneralName,_std::allocator<GeneralName>_> *)cbSize;
  cbSize_local = cbPrefix;
  cbPrefix_local = (size_t *)cbIn;
  cbIn_local = (size_t)pIn;
  pIn_local._0_4_ = type;
  std::vector<GeneralName,_std::allocator<GeneralName>_>::clear(out);
  bVar1 = DecodeSequenceOrSet((DerType)pIn_local,(uchar *)cbIn_local,(size_t)cbPrefix_local,
                              cbSize_local,(size_t *)out_local,(bool *)((long)&offset + 7));
  if (bVar1) {
    if ((offset._7_1_ & 1) == 0) {
      cbElement = *cbSize_local;
      cbPrefix_local =
           (size_t *)
           ((long)&(((out_local->super__Vector_base<GeneralName,_std::allocator<GeneralName>_>).
                     _M_impl.super__Vector_impl_data._M_start)->super_ChoiceType).super_DerBase.
                   _vptr_DerBase + *cbSize_local);
      do {
        t.super_ChoiceType.derType.constructed = false;
        t.super_ChoiceType.derType._9_3_ = 0;
        t.super_ChoiceType._68_4_ = 0;
        GeneralName::GeneralName((GeneralName *)local_98);
        if (cbPrefix_local < cbElement) {
          this = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(this,"Integer overflow");
          __cxa_throw(this,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        bVar1 = ChoiceType::Decode((ChoiceType *)local_98,(uchar *)(cbIn_local + cbElement),
                                   (long)cbPrefix_local - cbElement,
                                   (size_t *)&t.super_ChoiceType.derType.constructed);
        if (bVar1) {
          cbElement = cbElement + t.super_ChoiceType._64_8_;
          std::vector<GeneralName,_std::allocator<GeneralName>_>::push_back
                    (pvStack_38,(value_type *)local_98);
          if (cbElement ==
              (long)&(((out_local->super__Vector_base<GeneralName,_std::allocator<GeneralName>_>).
                       _M_impl.super__Vector_impl_data._M_start)->super_ChoiceType).super_DerBase.
                     _vptr_DerBase + *cbSize_local) {
            pIn_local._7_1_ = 1;
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
        }
        else {
          if (t.super_ChoiceType._64_8_ == 0) {
            *cbSize_local = 0;
            (out_local->super__Vector_base<GeneralName,_std::allocator<GeneralName>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
          }
          pIn_local._7_1_ = 0;
          bVar1 = true;
        }
        GeneralName::~GeneralName((GeneralName *)local_98);
      } while (!bVar1);
    }
    else {
      *cbSize_local = 2;
      (out_local->super__Vector_base<GeneralName,_std::allocator<GeneralName>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pIn_local._7_1_ = 1;
    }
  }
  else {
    *cbSize_local = 0;
    (out_local->super__Vector_base<GeneralName,_std::allocator<GeneralName>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pIn_local._7_1_ = 0;
  }
  return (bool)(pIn_local._7_1_ & 1);
}

Assistant:

static bool DecodeSetOrSequenceOf(DerType type, const unsigned char* pIn, size_t cbIn, size_t& cbPrefix, size_t& cbSize, std::vector<T>& out)
	{
		bool isNull = false;
		size_t offset = 0;

		out.clear();

		if (!DecodeSequenceOrSet(type, pIn, cbIn, cbPrefix, cbSize, isNull))
		{
			cbPrefix = 0;
			cbSize = 0;
			return false;
		}

		if (isNull)
		{
			cbPrefix = 2;
			cbSize = 0;
			return true;
		}

		offset = cbPrefix;
        cbIn = cbPrefix + cbSize;

		for (;;)
		{
			size_t cbElement = 0;
			T t;

			if (offset > cbIn)
				throw std::overflow_error("Integer overflow");

			if (!t.Decode(pIn + offset, cbIn - offset, cbElement))
			{
				// Accomodate the case where we have to decode into the 
				// sequence to see if the element is optional
				if( cbElement == 0 )
				{
					cbPrefix = 0;
					cbSize = 0;
				}
				return false;
			}

			offset += cbElement;
			out.push_back(t);

			// Exit conditions - should have used all of our
			// incoming data, as long as everything is polite
			if (offset == cbSize + cbPrefix)
			{
				return true;
			}
		}
	}